

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O0

int dwarf_get_ranges_baseaddress
              (Dwarf_Debug dw_dbg,Dwarf_Die dw_die,Dwarf_Bool *dw_known_base,
              Dwarf_Unsigned *dw_baseaddress,Dwarf_Bool *dw_at_ranges_offset_present,
              Dwarf_Unsigned *dw_at_ranges_offset,Dwarf_Error *dw_error)

{
  int iVar1;
  Dwarf_Unsigned DStack_80;
  int res;
  Dwarf_Unsigned die_base_addr;
  Dwarf_Debug pDStack_70;
  Dwarf_Bool have_die_base_addr;
  Dwarf_Unsigned die_ranges_offset;
  Dwarf_Bool have_die_ranges_offset;
  Dwarf_Bool local_base_addr_present;
  Dwarf_Unsigned local_base_addr;
  Dwarf_Debug pDStack_50;
  Dwarf_Bool local_ranges_offset_present;
  Dwarf_Unsigned local_ranges_offset;
  Dwarf_CU_Context_conflict context;
  Dwarf_Unsigned *dw_at_ranges_offset_local;
  Dwarf_Bool *dw_at_ranges_offset_present_local;
  Dwarf_Unsigned *dw_baseaddress_local;
  Dwarf_Bool *dw_known_base_local;
  Dwarf_Die dw_die_local;
  Dwarf_Debug dw_dbg_local;
  
  local_ranges_offset = 0;
  pDStack_50 = (Dwarf_Debug)0x0;
  local_base_addr._4_4_ = 0;
  _have_die_ranges_offset = 0;
  die_ranges_offset._4_4_ = 0;
  die_ranges_offset._0_4_ = 0;
  pDStack_70 = (Dwarf_Debug)0x0;
  die_base_addr._4_4_ = 0;
  DStack_80 = 0;
  context = (Dwarf_CU_Context_conflict)dw_at_ranges_offset;
  dw_at_ranges_offset_local = (Dwarf_Unsigned *)dw_at_ranges_offset_present;
  dw_at_ranges_offset_present_local = (Dwarf_Bool *)dw_baseaddress;
  dw_baseaddress_local = (Dwarf_Unsigned *)dw_known_base;
  dw_known_base_local = (Dwarf_Bool *)dw_die;
  dw_die_local = (Dwarf_Die)dw_dbg;
  if ((dw_dbg == (Dwarf_Debug)0x0) || (dw_dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,dw_error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_baseaddress()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dw_dbg_local._4_4_ = 1;
  }
  else if (dw_die == (Dwarf_Die)0x0) {
    if (dw_known_base != (Dwarf_Bool *)0x0) {
      *dw_known_base = 0;
      *dw_at_ranges_offset_present = 0;
    }
    if (dw_baseaddress != (Dwarf_Unsigned *)0x0) {
      *dw_baseaddress = 0;
      *dw_at_ranges_offset = 0;
    }
    dw_dbg_local._4_4_ = 0;
  }
  else {
    iVar1 = _dwarf_determine_die_range_offset
                      (dw_dbg,dw_die,(Dwarf_Bool *)&die_ranges_offset,
                       (Dwarf_Unsigned *)&stack0xffffffffffffff90,
                       (Dwarf_Bool *)((long)&die_base_addr + 4),&stack0xffffffffffffff80,dw_error);
    if ((iVar1 != 0) && (iVar1 == 1)) {
      dwarf_dealloc_error((Dwarf_Debug)dw_die_local,*dw_error);
      *dw_error = (Dwarf_Error)0x0;
    }
    local_ranges_offset = *(Dwarf_Unsigned *)(dw_known_base_local + 4);
    if (local_ranges_offset == 0) {
      _dwarf_error_string((Dwarf_Debug)dw_die_local,dw_error,0x68,
                          "DW_DLE_DIE_NO_CU_CONTEXT: in a call to dwarf_get_ranges_baseaddress");
      dw_dbg_local._4_4_ = 1;
    }
    else {
      if ((int)die_ranges_offset == 0) {
        local_base_addr._4_4_ = *(int *)(local_ranges_offset + 0x150);
        pDStack_50 = *(Dwarf_Debug *)(local_ranges_offset + 0x1f0);
      }
      else {
        local_base_addr._4_4_ = (int)die_ranges_offset;
        pDStack_50 = pDStack_70;
      }
      if (context != (Dwarf_CU_Context_conflict)0x0) {
        context->cc_dbg = pDStack_50;
      }
      if (dw_at_ranges_offset_local != (Dwarf_Unsigned *)0x0) {
        *(int *)dw_at_ranges_offset_local = local_base_addr._4_4_;
      }
      if (die_base_addr._4_4_ == 0) {
        if (*(int *)(local_ranges_offset + 0x134) != 0) {
          die_ranges_offset._4_4_ = 1;
          _have_die_ranges_offset = *(Dwarf_Unsigned *)(local_ranges_offset + 0x158);
        }
      }
      else {
        die_ranges_offset._4_4_ = die_base_addr._4_4_;
        _have_die_ranges_offset = DStack_80;
      }
      if (dw_at_ranges_offset_present_local != (Dwarf_Bool *)0x0) {
        *(Dwarf_Unsigned *)dw_at_ranges_offset_present_local = _have_die_ranges_offset;
        *(int *)dw_baseaddress_local = die_ranges_offset._4_4_;
      }
      dw_dbg_local._4_4_ = 0;
    }
  }
  return dw_dbg_local._4_4_;
}

Assistant:

int
dwarf_get_ranges_baseaddress(Dwarf_Debug dw_dbg,
    Dwarf_Die       dw_die,
    Dwarf_Bool     *dw_known_base,
    Dwarf_Unsigned *dw_baseaddress,
    Dwarf_Bool     *dw_at_ranges_offset_present,
    Dwarf_Unsigned *dw_at_ranges_offset,
    Dwarf_Error    *dw_error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Unsigned local_ranges_offset = 0;
    Dwarf_Bool     local_ranges_offset_present = FALSE;
    Dwarf_Unsigned local_base_addr= 0;
    Dwarf_Bool     local_base_addr_present = FALSE;
    Dwarf_Bool     have_die_ranges_offset = FALSE;
    Dwarf_Unsigned die_ranges_offset = 0;
    Dwarf_Bool     have_die_base_addr = FALSE;
    Dwarf_Unsigned die_base_addr = 0;
    int            res = 0;

    CHECK_DBG(dw_dbg,dw_error,"dwarf_get_ranges_baseaddress()");
    if (!dw_die) {
        if (dw_known_base) {
            *dw_known_base = FALSE;
            *dw_at_ranges_offset_present = FALSE;
        }
        if (dw_baseaddress) {
            *dw_baseaddress = 0;
            *dw_at_ranges_offset = 0;
        }
        return DW_DLV_OK;
    }
    /*  If the DIE passed in has a DW_AT_ranges attribute
        we will use that DIE ranges offset.
        Otherwise we use the DW_AT_ranges from the
        CU DIE (if any)
        If the DIE passed in has a DW_AT_low_pc
        attribute we will use that as the ranges
        base address, otherwise we use the
        cu context base adddress (if present) ...
        which may be incorrect... ? */
    res = _dwarf_determine_die_range_offset(dw_dbg,
        dw_die,&have_die_ranges_offset,&die_ranges_offset,
        &have_die_base_addr,&die_base_addr,dw_error);
    if (res != DW_DLV_OK ) {
        if (res == DW_DLV_ERROR) {
            /*  Suppressing knowledge of any error */
            dwarf_dealloc_error(dw_dbg,*dw_error);
            *dw_error = 0;
        }
    }

    context = dw_die->di_cu_context;
    if (!context) {
        _dwarf_error_string(dw_dbg, dw_error,
            DW_DLE_DIE_NO_CU_CONTEXT,
            "DW_DLE_DIE_NO_CU_CONTEXT: in a call to "
            "dwarf_get_ranges_baseaddress");
        return DW_DLV_ERROR;
    }
    if (have_die_ranges_offset) {
        local_ranges_offset_present = have_die_ranges_offset;
        local_ranges_offset = die_ranges_offset;
    } else {
        local_ranges_offset_present =
            context->cc_at_ranges_offset_present;
        local_ranges_offset =
            context->cc_at_ranges_offset;
    }
    if (dw_at_ranges_offset) {
        *dw_at_ranges_offset = local_ranges_offset;
    }
    if (dw_at_ranges_offset_present) {
        *dw_at_ranges_offset_present = local_ranges_offset_present;
    }
    if (have_die_base_addr) {
        local_base_addr_present = have_die_base_addr;
        local_base_addr = die_base_addr;
    } else {
        if (context->cc_low_pc_present ) {
            local_base_addr_present = TRUE;
            local_base_addr = context->cc_low_pc;
        }
    }
    if (dw_baseaddress) {
        /*  Unless cc_low_pc_present is TRUE
            cc_low_pc is always zero, and it
            could be zero regardless. */

        *dw_baseaddress = local_base_addr;
        *dw_known_base = local_base_addr_present;
    }
    return DW_DLV_OK;
}